

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TaprootScriptTree_TreeTest1_Test::TestBody(TaprootScriptTree_TreeTest1_Test *this)

{
  ScriptBuilder *pSVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_1;
  bool is_parity;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_9;
  char *exp_str;
  AssertionResult gtest_ar_2;
  char *exp_hash;
  TaprootScriptTree branch;
  SchnorrPubkey schnorr_pubkey;
  TaprootScriptTree root;
  TaprootScriptTree tree1;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey2;
  Pubkey pubkey;
  ByteData256 tweak2;
  ByteData256 tweak1;
  TaprootScriptTree tree2;
  TaprootScriptTree tree3;
  Privkey key;
  Script tree_2_of_2_sig;
  Script script_true;
  Script script;
  
  std::__cxx11::string::string
            ((string *)&tree1,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             (allocator *)&tree2);
  cfd::core::Privkey::Privkey(&key,(string *)&tree1,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree1);
  std::__cxx11::string::string
            ((string *)&tree1,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&tree2);
  cfd::core::ByteData256::ByteData256(&tweak1,(string *)&tree1);
  std::__cxx11::string::~string((string *)&tree1);
  std::__cxx11::string::string
            ((string *)&tree1,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)&tree2);
  cfd::core::ByteData256::ByteData256(&tweak2,(string *)&tree1);
  std::__cxx11::string::~string((string *)&tree1);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tree1,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&tree2,
             "\"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree1);
  std::__cxx11::string::~string((string *)&tree1);
  if ((char)tree2.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree1);
    if (tree2.super_TapBranch._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tree2.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree3,(Message *)&tree1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree2.super_TapBranch.has_leaf_);
  tree2.super_TapBranch._vptr_TapBranch =
       (_func_int **)CONCAT71(tree2.super_TapBranch._vptr_TapBranch._1_7_,is_parity);
  tree2.super_TapBranch.has_leaf_ = false;
  tree2.super_TapBranch.leaf_version_ = '\0';
  tree2.super_TapBranch._10_6_ = 0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&tree3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tree1,(internal *)&tree2,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&root,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xca,(char *)tree1.super_TapBranch._vptr_TapBranch);
    testing::internal::AssertHelper::operator=((AssertHelper *)&root,(Message *)&tree3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&root);
    std::__cxx11::string::~string((string *)&tree1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree2.super_TapBranch.has_leaf_);
  cfd::core::SchnorrPubkey::CreateTweakAdd(&schnorr_pubkey2,&schnorr_pubkey,&tweak1,(bool *)0x0);
  cfd::core::SchnorrPubkey::CreateTweakAdd(&schnorr_pubkey3,&schnorr_pubkey,&tweak2,(bool *)0x0);
  tree1.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_005ba258;
  tree1.super_TapBranch.has_leaf_ = false;
  tree1.super_TapBranch.leaf_version_ = '\0';
  tree1.super_TapBranch._10_6_ = 0;
  tree1.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree1.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&tree2,&schnorr_pubkey);
  pSVar1 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree1,(ByteData *)&tree2);
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&script,pSVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree2);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree1);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree1,&script);
  tree2.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_005ba258;
  tree2.super_TapBranch.has_leaf_ = false;
  tree2.super_TapBranch.leaf_version_ = '\0';
  tree2.super_TapBranch._10_6_ = 0;
  tree2.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree2.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)&tree2,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build(&script_true,pSVar1);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree2);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree2,&script_true);
  tree3.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_005ba258;
  tree3.super_TapBranch.has_leaf_ = false;
  tree3.super_TapBranch.leaf_version_ = '\0';
  tree3.super_TapBranch._10_6_ = 0;
  tree3.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree3.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&root,&schnorr_pubkey2);
  pSVar1 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree3,(ByteData *)&root);
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData((ByteData *)&branch,&schnorr_pubkey3);
  pSVar1 = cfd::core::ScriptBuilder::operator<<(pSVar1,(ByteData *)&branch);
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&tree_2_of_2_sig,pSVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&branch);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&root);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree3);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree3,&tree_2_of_2_sig);
  exp_hash = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  exp_str = 
  "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
  ;
  cfd::core::TaprootScriptTree::TaprootScriptTree(&root,&tree1);
  cfd::core::TaprootScriptTree::AddBranch(&root,&tree2);
  cfd::core::TaprootScriptTree::AddBranch(&root,&tree3);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_2,&root.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&branch,(ByteData256 *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&branch);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&branch);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&branch,&root.super_TapBranch);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_str","root.ToString()",&exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&branch);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&branch);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::TaprootScriptTree::operator=(&root,&tree2);
  cfd::core::TaprootScriptTree::AddBranch(&root,&tree1);
  cfd::core::TaprootScriptTree::AddBranch(&root,&tree3);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_2,&root.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&branch,(ByteData256 *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&branch);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&branch);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&branch,&root.super_TapBranch);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_str","root.ToString()",&exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&branch);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&branch);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&branch);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&branch,&tree2);
  cfd::core::TaprootScriptTree::AddBranch(&branch,&tree1);
  cfd::core::TaprootScriptTree::operator=(&root,&tree3);
  cfd::core::TaprootScriptTree::AddBranch(&root,&branch);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_1,&root.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_2,(ByteData256 *)&gtest_ar_1);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_5,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&gtest_ar_2,&root.super_TapBranch);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"exp_str","root.ToString()",&exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TaprootScriptTree::operator=(&root,&tree3);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_2,&branch.super_TapBranch);
  cfd::core::TaprootScriptTree::AddBranch(&root,(ByteData256 *)&gtest_ar_2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_1,&root.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_2,(ByteData256 *)&gtest_ar_1);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_5,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&gtest_ar_2,&root.super_TapBranch);
  testing::internal::CmpHelperEQ<char[208],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
             ,"root.ToString()",
             (char (*) [208])
             "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,exp_str,(allocator *)&gtest_ar_9);
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0;
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)&gtest_ar_2,(string *)&gtest_ar_1,&script,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  cfd::core::TaprootScriptTree::operator=(&root,(TaprootScriptTree *)&gtest_ar_2);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_2);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&script);
  cfd::core::TapBranch::GetScript((Script *)&gtest_ar_2,&root.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_5,(Script *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_9,"script.GetHex()","root.GetScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::Script::~Script((Script *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  gtest_ar_9.success_ = true;
  gtest_ar_9._1_3_ = 0;
  cfd::core::TapBranch::GetBranchList
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2,
             &root.super_TapBranch);
  gtest_ar_5._0_8_ =
       ((long)gtest_ar_2.message_.ptr_ - CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_)) / 0x78;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"2","root.GetBranchList().size()",(int *)&gtest_ar_9,
             (unsigned_long *)&gtest_ar_5);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,exp_str,(allocator *)&gtest_ar_9);
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0;
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)&gtest_ar_2,(string *)&gtest_ar_1,&script_true,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  cfd::core::TaprootScriptTree::operator=(&root,(TaprootScriptTree *)&gtest_ar_2);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_2);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&script_true);
  cfd::core::TapBranch::GetScript((Script *)&gtest_ar_2,&root.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_5,(Script *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_9,"script_true.GetHex()","root.GetScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::Script::~Script((Script *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  gtest_ar_9.success_ = true;
  gtest_ar_9._1_3_ = 0;
  cfd::core::TapBranch::GetBranchList
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2,
             &root.super_TapBranch);
  gtest_ar_5._0_8_ =
       ((long)gtest_ar_2.message_.ptr_ - CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_)) / 0x78;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"2","root.GetBranchList().size()",(int *)&gtest_ar_9,
             (unsigned_long *)&gtest_ar_5);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,exp_str,(allocator *)&gtest_ar_9);
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0;
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)&gtest_ar_2,(string *)&gtest_ar_1,&tree_2_of_2_sig,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  cfd::core::TaprootScriptTree::operator=(&root,(TaprootScriptTree *)&gtest_ar_2);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_2);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_5)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&tree_2_of_2_sig);
  cfd::core::TapBranch::GetScript((Script *)&gtest_ar_2,&root.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_5,(Script *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_9,"tree_2_of_2_sig.GetHex()","root.GetScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::Script::~Script((Script *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  gtest_ar_9.success_ = true;
  gtest_ar_9._1_3_ = 0;
  cfd::core::TapBranch::GetBranchList
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2,
             &root.super_TapBranch);
  gtest_ar_5._0_8_ =
       ((long)gtest_ar_2.message_.ptr_ - CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_)) / 0x78;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"1","root.GetBranchList().size()",(int *)&gtest_ar_9,
             (unsigned_long *)&gtest_ar_5);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&branch);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&root);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree3);
  cfd::core::Script::~Script(&tree_2_of_2_sig);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree2);
  cfd::core::Script::~Script(&script_true);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree1);
  cfd::core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest1) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);
  SchnorrPubkey schnorr_pubkey2 = schnorr_pubkey.CreateTweakAdd(tweak1);
  SchnorrPubkey schnorr_pubkey3 = schnorr_pubkey.CreateTweakAdd(tweak2);

  Script script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree1(script);

  Script script_true = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  TaprootScriptTree tree2(script_true);

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script tree_2_of_2_sig = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey3.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree3(tree_2_of_2_sig);

  auto exp_hash = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  auto exp_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  TaprootScriptTree root = tree1;
  root.AddBranch(tree2);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  root = tree2;
  root.AddBranch(tree1);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  auto branch = tree2;
  branch.AddBranch(tree1);
  root = tree3;
  root.AddBranch(branch);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  // blind leaf
  root = tree3;
  root.AddBranch(branch.GetCurrentBranchHash());
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(
      "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
      root.ToString());

  root = TaprootScriptTree::FromString(exp_str, script);
  EXPECT_EQ(script.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, script_true);
  EXPECT_EQ(script_true.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, tree_2_of_2_sig);
  EXPECT_EQ(tree_2_of_2_sig.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(1, root.GetBranchList().size());
}